

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

string * rcg::(anonymous_namespace)::cTLGetInfo_abi_cxx11_
                   (TL_HANDLE tl,shared_ptr<const_rcg::GenTLWrapper> *gentl,TL_INFO_CMD info)

{
  element_type *peVar1;
  TL_INFO_CMD in_ECX;
  TL_HANDLE in_RSI;
  string *in_RDI;
  bool bVar2;
  size_t i;
  GC_ERROR err;
  size_t tmp_size;
  char tmp [1024];
  INFO_DATATYPE type;
  string *ret;
  ulong local_450;
  int local_434;
  size_t local_430;
  char local_428 [1028];
  int local_24;
  undefined1 local_1d;
  TL_INFO_CMD local_1c;
  TL_HANDLE local_10;
  
  local_1d = 0;
  local_1c = in_ECX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  memset(local_428,0,0x400);
  local_430 = 0x400;
  if (local_10 == (TL_HANDLE)0x0) {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x111a6e);
    local_434 = (*peVar1->GCGetInfo)(local_1c,&local_24,local_428,&local_430);
  }
  else {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x111a0a);
    local_434 = (*peVar1->TLGetInfo)(local_10,local_1c,&local_24,local_428,&local_430);
  }
  if ((local_434 == 0) && (local_24 == 1)) {
    local_450 = 0;
    while( true ) {
      bVar2 = false;
      if (local_450 < local_430) {
        bVar2 = local_428[local_450] != '\0';
      }
      if (!bVar2) break;
      std::__cxx11::string::push_back((char)in_RDI);
      local_450 = local_450 + 1;
    }
  }
  return in_RDI;
}

Assistant:

std::string cTLGetInfo(GenTL::TL_HANDLE tl, const std::shared_ptr<const GenTLWrapper> &gentl,
                       GenTL::TL_INFO_CMD info)
{
  std::string ret;

  GenTL::INFO_DATATYPE type;
  char tmp[1024]="";
  size_t tmp_size=sizeof(tmp);
  GenTL::GC_ERROR err=GenTL::GC_ERR_SUCCESS;

  if (tl != 0)
  {
    err=gentl->TLGetInfo(tl, info, &type, tmp, &tmp_size);
  }
  else
  {
    err=gentl->GCGetInfo(info, &type, tmp, &tmp_size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_STRING)
  {
    for (size_t i=0; i<tmp_size && tmp[i] != '\0'; i++)
    {
      ret.push_back(tmp[i]);
    }
  }

  return ret;
}